

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::BindSparseResourceMemory
          (DeviceContextVkImpl *this,BindSparseResourceMemoryAttribs *Attribs)

{
  VkSparseMemoryBind *pVVar1;
  pointer *pppVVar2;
  int iVar3;
  int iVar4;
  SparseTextureMemoryBindInfo *pSVar5;
  TextureBase<Diligent::EngineVkImplTraits> *pTVar6;
  SparseBufferMemoryBindInfo *pSVar7;
  BufferVkImpl *this_00;
  SparseBufferMemoryBindRange *pSVar8;
  undefined8 *puVar9;
  VkDeviceSize VVar10;
  SparseTextureMemoryBindRange *pSVar11;
  FenceBase<Diligent::EngineVkImplTraits> *this_01;
  iterator iVar12;
  FenceVkImpl *pFVar13;
  VkSemaphore_T *pVVar14;
  iterator __position;
  Uint64 Value;
  pointer ppVVar15;
  pointer puVar16;
  bool bVar17;
  RefCntAutoPtr<Diligent::IDeviceMemoryVk> RVar18;
  pointer pVVar19;
  SoftwareQueueIndex SVar20;
  VkImageAspectFlags VVar21;
  uint uVar22;
  SparseTextureProperties *pSVar23;
  VkBuffer pVVar24;
  ulong uVar25;
  TextureFormatAttribs *pTVar26;
  VkSemaphore_T **ppVVar27;
  CommandQueueVkImpl *this_02;
  byte bVar28;
  char (*in_RCX) [60];
  ulong uVar29;
  char (*Args_1) [50];
  VkSparseImageMemoryBindInfo *Args_1_00;
  uint uVar30;
  long lVar32;
  uint uVar33;
  BindSparseResourceMemoryAttribs *pBVar34;
  uint uVar35;
  uint uVar36;
  iterator iVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar43;
  size_type __n;
  SparseBufferProperties SVar44;
  BindSparseResourceMemoryAttribs *pBVar45;
  ulong local_1c0;
  RefCntAutoPtr<Diligent::IDeviceMemoryVk> pMemVk;
  RefCountersImpl *pRStack_1b0;
  VkSemaphore WaitSem;
  VkBindSparseInfo BindSparse;
  VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo;
  ulong local_f0;
  vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_> vkImageBinds;
  vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  vkImageOpaqueBinds;
  vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> vkMemoryBinds;
  vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_> vkBufferBinds;
  vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_> vkImageMemoryBinds;
  SyncPointVkPtr local_50;
  ulong local_40;
  long local_38;
  Uint32 UVar31;
  
  uVar41 = 0;
  DeviceContextBase<Diligent::EngineVkImplTraits>::BindSparseResourceMemory
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  if (Attribs->NumTextureBinds == 0 && Attribs->NumBufferBinds == 0) {
    FormatString<char[26],char[60]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0",in_RCX);
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xfc7);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  pBVar45 = Attribs;
  Flush(this,0,(ICommandList **)0x0);
  if ((ulong)Attribs->NumBufferBinds != 0) {
    lVar32 = 0;
    uVar41 = 0;
    do {
      uVar41 = uVar41 + *(int *)((long)&Attribs->pBufferBinds->NumRanges + lVar32);
      lVar32 = lVar32 + 0x18;
    } while ((ulong)Attribs->NumBufferBinds * 0x18 != lVar32);
  }
  uVar42 = 0;
  if (Attribs->NumTextureBinds == 0) {
    __n = 0;
    local_1c0 = 0;
  }
  else {
    local_1c0 = 0;
    uVar29 = 0;
    uVar39 = 0;
    uVar42 = 0;
    do {
      pSVar5 = Attribs->pTextureBinds;
      pTVar6 = (TextureBase<Diligent::EngineVkImplTraits> *)pSVar5[uVar29].pTexture;
      Attribs = pBVar45;
      if (pTVar6 != (TextureBase<Diligent::EngineVkImplTraits> *)0x0) {
        CheckDynamicType<Diligent::TextureVkImpl_const,Diligent::ITexture>((ITexture *)pTVar6);
        Attribs = pBVar45;
      }
      pSVar23 = TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties(pTVar6);
      if ((ulong)pSVar5[uVar29].NumRanges == 0) {
        uVar43 = 0;
      }
      else {
        lVar32 = 0;
        iVar38 = 0;
        do {
          if (*(uint *)((long)&(pSVar5[uVar29].pRanges)->MipLevel + lVar32) <
              pSVar23->FirstMipInTail) {
            iVar38 = iVar38 + 1;
            uVar42 = (ulong)((int)uVar42 + 1);
          }
          else {
            uVar41 = uVar41 + 1;
            uVar39 = uVar39 + 1;
          }
          lVar32 = lVar32 + 0x40;
        } while ((ulong)pSVar5[uVar29].NumRanges << 6 != lVar32);
        uVar43 = (uint)(iVar38 != 0);
      }
      local_1c0 = (ulong)((int)local_1c0 + uVar43);
      uVar29 = uVar29 + 1;
      pBVar45 = Attribs;
    } while (uVar29 < Attribs->NumTextureBinds);
    __n = (size_type)uVar39;
  }
  std::vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::vector
            (&vkBufferBinds,(ulong)Attribs->NumBufferBinds,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  ::vector(&vkImageOpaqueBinds,__n,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::vector
            (&vkImageBinds,local_1c0,(allocator_type *)&BindSparse);
  std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::vector
            (&vkMemoryBinds,(ulong)uVar41,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::vector
            (&vkImageMemoryBinds,uVar42,(allocator_type *)&BindSparse);
  if (Attribs->NumBufferBinds == 0) {
    uVar41 = 0;
  }
  else {
    uVar42 = 0;
    uVar41 = 0;
    do {
      pSVar7 = Attribs->pBufferBinds;
      this_00 = (BufferVkImpl *)pSVar7[uVar42].pBuffer;
      Attribs = pBVar45;
      if (this_00 != (BufferVkImpl *)0x0) {
        CheckDynamicType<Diligent::BufferVkImpl_const,Diligent::IBuffer>((IBuffer *)this_00);
        Attribs = pBVar45;
      }
      SVar44 = BufferVkImpl::GetSparseProperties(this_00);
      pVVar19 = vkBufferBinds.
                super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar24 = BufferVkImpl::GetVkBuffer(this_00);
      pVVar19[uVar42].buffer = pVVar24;
      pVVar19[uVar42].bindCount = pSVar7[uVar42].NumRanges;
      pVVar19[uVar42].pBinds =
           vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar41;
      if (pSVar7[uVar42].NumRanges != 0) {
        lVar32 = 0x18;
        uVar29 = 0;
        do {
          pSVar8 = pSVar7[uVar42].pRanges;
          puVar9 = *(undefined8 **)((long)&pSVar8->BufferOffset + lVar32);
          pMemVk.m_pObject = (IDeviceMemoryVk *)0x0;
          if (puVar9 != (undefined8 *)0x0) {
            (**(code **)*puVar9)(puVar9,IID_DeviceMemoryVk,&pMemVk);
          }
          if ((pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) ==
              (*(long *)((long)&pSVar8->BufferOffset + lVar32) != 0)) {
            FormatString<char[70]>
                      ((string *)&BindSparse,
                       (char (*) [70])
                       "Failed to query IDeviceMemoryVk interface from non-null memory object");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1009);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          if (pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) {
            TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            TimelineSemaphoreSubmitInfo._4_4_ = 0;
            TimelineSemaphoreSubmitInfo.pNext = (void *)0x0;
            TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount = 0;
            TimelineSemaphoreSubmitInfo._20_4_ = 0;
          }
          else {
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[0xb])
                      (&TimelineSemaphoreSubmitInfo,pMemVk.m_pObject,
                       *(undefined8 *)((long)pSVar8 + lVar32 + -0x10),
                       *(undefined8 *)((long)pSVar8 + lVar32 + -8));
          }
          if ((ulong)TimelineSemaphoreSubmitInfo.pNext % (ulong)SVar44.BlockSize != 0) {
            FormatString<char[71]>
                      ((string *)&BindSparse,
                       (char (*) [71])
                       "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x100d);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          uVar25 = uVar29 + uVar41 & 0xffffffff;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar25].resourceOffset =
               *(VkDeviceSize *)((long)pSVar8 + lVar32 + -0x18);
          VVar10 = *(VkDeviceSize *)((long)pSVar8 + lVar32 + -8);
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar25].size = VVar10;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar25].memory =
               (VkDeviceMemory)TimelineSemaphoreSubmitInfo._0_8_;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar25].memoryOffset =
               (VkDeviceSize)TimelineSemaphoreSubmitInfo.pNext;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar25].flags = 0;
          if (VVar10 == 0) {
            FormatString<char[36]>
                      ((string *)&BindSparse,(char (*) [36])"Buffer memory size must not be zero");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1016);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          if (pMemVk.m_pObject != (IDeviceMemoryVk *)0x0) {
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[2])();
            pMemVk.m_pObject = (IDeviceMemoryVk *)0x0;
          }
          uVar29 = uVar29 + 1;
          lVar32 = lVar32 + 0x20;
        } while (uVar29 < pSVar7[uVar42].NumRanges);
        uVar41 = uVar41 + (int)uVar29;
      }
      uVar42 = uVar42 + 1;
      pBVar45 = Attribs;
    } while (uVar42 < Attribs->NumBufferBinds);
  }
  local_f0 = 0;
  if (Attribs->NumTextureBinds == 0) {
    uVar29 = 0;
    uVar42 = 0;
  }
  else {
    uVar42 = 0;
    uVar39 = 0;
    uVar25 = 0;
    do {
      pSVar5 = Attribs->pTextureBinds;
      pTVar6 = (TextureBase<Diligent::EngineVkImplTraits> *)pSVar5[uVar42].pTexture;
      Attribs = pBVar45;
      if (pTVar6 != (TextureBase<Diligent::EngineVkImplTraits> *)0x0) {
        CheckDynamicType<Diligent::TextureVkImpl_const,Diligent::ITexture>((ITexture *)pTVar6);
        Attribs = pBVar45;
      }
      pSVar23 = TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties(pTVar6);
      pTVar26 = GetTextureFormatAttribs
                          ((pTVar6->
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           ).m_Desc.Format);
      VVar21 = ComponentTypeToVkAspectMask(pTVar26->ComponentType);
      uVar43 = (uint)uVar25;
      local_40 = uVar25;
      if (pSVar5[uVar42].NumRanges == 0) {
        uVar33 = 0;
      }
      else {
        uVar29 = 0;
        lVar32 = 0x38;
        local_38 = uVar25 << 6;
        uVar33 = 0;
        do {
          pSVar11 = pSVar5[uVar42].pRanges;
          puVar9 = *(undefined8 **)((long)&pSVar11->MipLevel + lVar32);
          pMemVk.m_pObject = (IDeviceMemoryVk *)0x0;
          if (puVar9 != (undefined8 *)0x0) {
            (**(code **)*puVar9)(puVar9,IID_DeviceMemoryVk,&pMemVk);
          }
          if ((pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) ==
              (*(long *)((long)&pSVar11->MipLevel + lVar32) != 0)) {
            FormatString<char[70]>
                      ((string *)&BindSparse,
                       (char (*) [70])
                       "Failed to query IDeviceMemoryVk interface from non-null memory object");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1029);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          if (pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) {
            TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            TimelineSemaphoreSubmitInfo._4_4_ = 0;
            TimelineSemaphoreSubmitInfo.pNext = (void *)0x0;
            TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount = 0;
            TimelineSemaphoreSubmitInfo._20_4_ = 0;
          }
          else {
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[0xb])
                      (&TimelineSemaphoreSubmitInfo,pMemVk.m_pObject,
                       *(undefined8 *)((long)pSVar11 + lVar32 + -8),
                       *(undefined8 *)((long)pSVar11 + lVar32 + -0x10));
          }
          if ((ulong)TimelineSemaphoreSubmitInfo.pNext % (ulong)pSVar23->BlockSize != 0) {
            FormatString<char[74]>
                      ((string *)&BindSparse,
                       (char (*) [74])
                       "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x102d);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          uVar36 = *(uint *)((long)pSVar11 + lVar32 + -0x38);
          if (uVar36 < pSVar23->FirstMipInTail) {
            bVar28 = (byte)uVar36;
            uVar35 = (pTVar6->
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     ).m_Desc.Width >> (bVar28 & 0x1f);
            uVar22 = (pTVar6->
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     ).m_Desc.Height >> (bVar28 & 0x1f);
            UVar31 = 1;
            if ((pTVar6->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc.Type == RESOURCE_DIM_TEX_3D) {
              UVar31 = (pTVar6->
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       ).m_Desc.field_3.ArraySize;
            }
            uVar30 = UVar31 >> (bVar28 & 0x1f);
            *(undefined4 *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar33].subresource.arrayLayer +
             local_38) = *(undefined4 *)((long)pSVar11 + lVar32 + -0x34);
            *(VkImageAspectFlags *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar33].subresource.aspectMask +
             local_38) = VVar21;
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar33].subresource.mipLevel
                     + local_38) = uVar36;
            iVar38 = *(int *)((long)pSVar11 + lVar32 + -0x30);
            *(int *)((long)&vkImageMemoryBinds.
                            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar33].offset.x + local_38) =
                 iVar38;
            iVar3 = *(int *)((long)pSVar11 + lVar32 + -0x28);
            *(int *)((long)&vkImageMemoryBinds.
                            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar33].offset.y + local_38) =
                 iVar3;
            iVar4 = *(int *)((long)pSVar11 + lVar32 + -0x20);
            *(int *)((long)&vkImageMemoryBinds.
                            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar33].offset.z + local_38) =
                 iVar4;
            uVar40 = *(int *)((long)pSVar11 + lVar32 + -0x2c) - iVar38;
            uVar36 = (uVar35 + (uVar35 == 0)) - iVar38;
            if (uVar40 <= uVar36) {
              uVar36 = uVar40;
            }
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar33].extent.width +
                     local_38) = uVar36;
            uVar35 = *(int *)((long)pSVar11 + lVar32 + -0x24) -
                     *(int *)((long)pSVar11 + lVar32 + -0x28);
            uVar36 = (uVar22 + (uVar22 == 0)) - iVar3;
            if (uVar35 <= uVar36) {
              uVar36 = uVar35;
            }
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar33].extent.height +
                     local_38) = uVar36;
            uVar22 = *(int *)((long)pSVar11 + lVar32 + -0x1c) -
                     *(int *)((long)pSVar11 + lVar32 + -0x20);
            uVar36 = (uVar30 + (uVar30 == 0)) - iVar4;
            if (uVar22 <= uVar36) {
              uVar36 = uVar22;
            }
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar33].extent.depth +
                     local_38) = uVar36;
            *(undefined8 *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar33].memory + local_38) =
                 TimelineSemaphoreSubmitInfo._0_8_;
            *(void **)((long)&vkImageMemoryBinds.
                              super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar33].memoryOffset +
                      local_38) = TimelineSemaphoreSubmitInfo.pNext;
            *(undefined4 *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar33].flags + local_38) = 0;
            uVar33 = uVar33 + 1;
          }
          else {
            vkImageOpaqueBinds.
            super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar39].image =
                 (VkImage)pTVar6[1].
                          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          .m_pDevice;
            vkImageOpaqueBinds.
            super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar39].bindCount = 1;
            pVVar1 = vkMemoryBinds.
                     super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar41;
            vkImageOpaqueBinds.
            super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar39].pBinds = pVVar1;
            pVVar1->resourceOffset =
                 *(long *)((long)pSVar11 + lVar32 + -0x18) + pSVar23->MipTailOffset +
                 (ulong)*(uint *)((long)pSVar11 + lVar32 + -0x34) * pSVar23->MipTailStride;
            VVar10 = *(VkDeviceSize *)((long)pSVar11 + lVar32 + -0x10);
            pVVar1->size = VVar10;
            pVVar1->memory = (VkDeviceMemory)TimelineSemaphoreSubmitInfo._0_8_;
            pVVar1->memoryOffset = (VkDeviceSize)TimelineSemaphoreSubmitInfo.pNext;
            pVVar1->flags = 0;
            if (VVar10 == 0) {
              FormatString<char[46]>
                        ((string *)&BindSparse,
                         (char (*) [46])"Texture mip tail memory size must not be zero");
              DebugAssertionFailed
                        ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x1054);
              if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
                operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
              }
            }
            uVar39 = uVar39 + 1;
            uVar41 = uVar41 + 1;
            uVar36 = (uint)(pTVar6->
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           ).m_Desc.Type;
            if ((((uVar36 < 9) && ((0x1a8U >> (uVar36 & 0x1f) & 1) != 0)) &&
                ((pSVar23->Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == SPARSE_TEXTURE_FLAG_NONE))
               && (pSVar23->MipTailStride == 0)) {
              FormatString<char[110]>
                        ((string *)&BindSparse,
                         (char (*) [110])
                         "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero"
                        );
              DebugAssertionFailed
                        ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x1056);
              if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
                operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
              }
            }
          }
          if (pMemVk.m_pObject != (IDeviceMemoryVk *)0x0) {
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[2])();
            pMemVk.m_pObject = (IDeviceMemoryVk *)0x0;
          }
          uVar29 = uVar29 + 1;
          lVar32 = lVar32 + 0x40;
        } while (uVar29 < pSVar5[uVar42].NumRanges);
      }
      if (uVar33 != 0) {
        vkImageBinds.
        super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_start[local_f0].image =
             (VkImage)pTVar6[1].
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_pDevice;
        vkImageBinds.
        super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_start[local_f0].bindCount = uVar33;
        vkImageBinds.
        super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
        ._M_impl.super__Vector_impl_data._M_start[local_f0].pBinds =
             vkImageMemoryBinds.
             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
             _M_impl.super__Vector_impl_data._M_start + local_40;
        uVar43 = uVar43 + uVar33;
        local_f0 = (ulong)((int)local_f0 + 1);
      }
      uVar25 = (ulong)uVar43;
      uVar42 = uVar42 + 1;
      pBVar45 = Attribs;
    } while (uVar42 < Attribs->NumTextureBinds);
    uVar29 = (ulong)uVar39;
    uVar42 = local_f0;
    local_f0 = uVar25;
  }
  Args_1 = (char (*) [50])
           ((long)vkMemoryBinds.
                  super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)vkMemoryBinds.
                  super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  if ((long)Args_1 * -0x3333333333333333 - (ulong)uVar41 != 0) {
    FormatString<char[26],char[40]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemoryBindCount == vkMemoryBinds.size()",(char (*) [40])Args_1);
    Args_1 = (char (*) [50])0x1065;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1065);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  if ((long)vkImageMemoryBinds.
            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)vkImageMemoryBinds.
            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>.
            _M_impl.super__Vector_impl_data._M_start >> 6 != local_f0) {
    FormatString<char[26],char[50]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageMemoryBindCount == vkImageMemoryBinds.size()",Args_1);
    Args_1 = (char (*) [50])0x1066;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1066);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  if (((long)vkImageBinds.
             super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)vkImageBinds.
             super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar42 != 0) {
    FormatString<char[26],char[38]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageBindCount == vkImageBinds.size()",(char (*) [38])Args_1);
    Args_1 = (char (*) [50])0x1067;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1067);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  pBVar34 = pBVar45;
  if (((long)vkImageOpaqueBinds.
             super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)vkImageOpaqueBinds.
             super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar29 != 0) {
    FormatString<char[26],char[47]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageOpqBindCount == vkImageOpaqueBinds.size()",(char (*) [47])Args_1
              );
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1068);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  BindSparse.pNext = (void *)0x0;
  BindSparse.signalSemaphoreCount = 0;
  BindSparse._84_4_ = 0;
  BindSparse.pSignalSemaphores = (VkSemaphore *)0x0;
  BindSparse.imageBindCount = 0;
  BindSparse._68_4_ = 0;
  BindSparse.pImageBinds = (VkSparseImageMemoryBindInfo *)0x0;
  BindSparse.imageOpaqueBindCount = 0;
  BindSparse._52_4_ = 0;
  BindSparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  BindSparse.bufferBindCount = 0;
  BindSparse._36_4_ = 0;
  BindSparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
  BindSparse.waitSemaphoreCount = 0;
  BindSparse._20_4_ = 0;
  BindSparse.pWaitSemaphores = (VkSemaphore *)0x0;
  BindSparse.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
  BindSparse._4_4_ = 0;
  TimelineSemaphoreSubmitInfo._0_8_ =
       ((long)vkBufferBinds.
              super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)vkBufferBinds.
              super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar41 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&TimelineSemaphoreSubmitInfo);
  BindSparse.bufferBindCount = uVar41;
  BindSparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
  if (vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    BindSparse.pBufferBinds =
         vkBufferBinds.
         super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  TimelineSemaphoreSubmitInfo._0_8_ =
       ((long)vkImageOpaqueBinds.
              super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)vkImageOpaqueBinds.
              super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar41 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&TimelineSemaphoreSubmitInfo);
  BindSparse.imageOpaqueBindCount = uVar41;
  BindSparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  if (vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    BindSparse.pImageOpaqueBinds =
         vkImageOpaqueBinds.
         super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  TimelineSemaphoreSubmitInfo._0_8_ =
       ((long)vkImageBinds.
              super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)vkImageBinds.
              super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar41 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&TimelineSemaphoreSubmitInfo);
  BindSparse.imageBindCount = uVar41;
  Args_1_00 = (VkSparseImageMemoryBindInfo *)0x0;
  if (vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Args_1_00 = vkImageBinds.
                super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  }
  BindSparse.pImageBinds = Args_1_00;
  if (((this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    FormatString<char[26],char[64]>
              ((string *)&TimelineSemaphoreSubmitInfo,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty()",
               (char (*) [64])Args_1_00);
    Args_1_00 = (VkSparseImageMemoryBindInfo *)0x1073;
    DebugAssertionFailed
              ((Char *)TimelineSemaphoreSubmitInfo._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1073);
    if ((uint32_t *)TimelineSemaphoreSubmitInfo._0_8_ !=
        &TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount) {
      operator_delete((void *)TimelineSemaphoreSubmitInfo._0_8_,
                      TimelineSemaphoreSubmitInfo._16_8_ + 1);
    }
  }
  if (((this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    FormatString<char[26],char[60]>
              ((string *)&TimelineSemaphoreSubmitInfo,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty()",
               (char (*) [60])Args_1_00);
    DebugAssertionFailed
              ((Char *)TimelineSemaphoreSubmitInfo._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1074);
    if ((uint32_t *)TimelineSemaphoreSubmitInfo._0_8_ !=
        &TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount) {
      operator_delete((void *)TimelineSemaphoreSubmitInfo._0_8_,
                      TimelineSemaphoreSubmitInfo._16_8_ + 1);
    }
  }
  if (pBVar45->NumSignalFences == 0) {
    bVar17 = false;
  }
  else {
    uVar42 = 0;
    bVar17 = false;
    do {
      this_01 = (FenceBase<Diligent::EngineVkImplTraits> *)pBVar34->ppSignalFences[uVar42];
      if (this_01 != (FenceBase<Diligent::EngineVkImplTraits> *)0x0) {
        CheckDynamicType<Diligent::FenceVkImpl,Diligent::IFence>((IFence *)this_01);
      }
      TimelineSemaphoreSubmitInfo._0_8_ = pBVar34->pSignalFenceValues[uVar42];
      if (this_01[1].
          super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
          .m_pDevice != (RenderDeviceVkImpl *)0x0) {
        FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                  (this_01,TimelineSemaphoreSubmitInfo._0_8_);
        pMemVk.m_pObject =
             (IDeviceMemoryVk *)
             this_01[1].
             super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
             .m_pDevice;
        iVar37._M_current =
             (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar37._M_current ==
            (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkSignalSemaphores,iVar37,(VkSemaphore_T **)&pMemVk);
        }
        else {
          *iVar37._M_current = (VkSemaphore_T *)pMemVk.m_pObject;
          pppVVar2 = &(this->m_VkSignalSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
        }
        iVar12._M_current =
             (this->m_SignalSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          bVar17 = true;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &this->m_SignalSemaphoreValues,iVar12,
                     (unsigned_long *)&TimelineSemaphoreSubmitInfo);
        }
        else {
          *iVar12._M_current = TimelineSemaphoreSubmitInfo._0_8_;
          (this->m_SignalSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          bVar17 = true;
        }
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < pBVar34->NumSignalFences);
  }
  pBVar45 = pBVar34;
  if (pBVar34->NumWaitFences != 0) {
    uVar42 = 0;
    do {
      pFVar13 = (FenceVkImpl *)pBVar34->ppWaitFences[uVar42];
      if (pFVar13 != (FenceVkImpl *)0x0) {
        CheckDynamicType<Diligent::FenceVkImpl,Diligent::IFence>((IFence *)pFVar13);
      }
      pMemVk.m_pObject = (IDeviceMemoryVk *)pBVar34->pWaitFenceValues[uVar42];
      FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
                ((FenceBase<Diligent::EngineVkImplTraits> *)pFVar13,(Uint64)pMemVk.m_pObject);
      pVVar14 = (pFVar13->m_TimelineSemaphore).m_VkObject;
      if (pVVar14 == (VkSemaphore_T *)0x0) {
        SVar20 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        FenceVkImpl::ExtractSignalSemaphore
                  ((VulkanRecycledSemaphore *)&TimelineSemaphoreSubmitInfo,pFVar13,SVar20,
                   (Uint64)pMemVk.m_pObject);
        if (TimelineSemaphoreSubmitInfo._16_8_ != 0) {
          WaitSem = (VkSemaphore)TimelineSemaphoreSubmitInfo._16_8_;
          iVar37._M_current =
               (this->m_VkWaitSemaphores).
               super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar37._M_current ==
              (this->m_VkWaitSemaphores).
              super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
            _M_realloc_insert<VkSemaphore_T*>
                      ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                       &this->m_VkWaitSemaphores,iVar37,&WaitSem);
          }
          else {
            *iVar37._M_current = (VkSemaphore_T *)TimelineSemaphoreSubmitInfo._16_8_;
            pppVVar2 = &(this->m_VkWaitSemaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppVVar2 = *pppVVar2 + 1;
          }
          WaitSem = (VkSemaphore)CONCAT44(WaitSem._4_4_,0x10000);
          __position._M_current =
               (this->m_WaitDstStageMasks).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_WaitDstStageMasks).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->m_WaitDstStageMasks,__position,(uint *)&WaitSem);
          }
          else {
            *__position._M_current = 0x10000;
            (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          std::
          vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
          ::
          emplace_back<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
                    ((vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
                      *)&this->m_WaitRecycledSemaphores,
                     (RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)
                     &TimelineSemaphoreSubmitInfo);
          WaitSem = (VkSemaphore)0x0;
          iVar12._M_current =
               (this->m_WaitSemaphoreValues).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this->m_WaitSemaphoreValues).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&this->m_WaitSemaphoreValues,iVar12,(unsigned_long *)&WaitSem);
          }
          else {
            *iVar12._M_current = 0;
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
        }
        VulkanUtilities::VulkanSyncObjectManager::
        RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject
                  ((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)
                   &TimelineSemaphoreSubmitInfo);
      }
      else {
        ppVVar27 = (this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        iVar37._M_current =
             (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        WaitSem = pVVar14;
        if (iVar37._M_current != ppVVar27) {
          lVar32 = 0;
          uVar29 = 0;
          do {
            if (ppVVar27[uVar29] == WaitSem) {
              FormatString<char[8],char_const*,char[15],unsigned_long,char[54],unsigned_long,char[2]>
                        ((string *)&TimelineSemaphoreSubmitInfo,(Diligent *)0x83a1f5,
                         (char (*) [8])
                         &(pFVar13->super_FenceBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                          .m_Desc,(char **)"\' with value (",(char (*) [15])&pMemVk,
                         (unsigned_long *)") is already added to the wait operation with value (",
                         (char (*) [54])
                         ((long)(this->m_WaitSemaphoreValues).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar32),
                         (unsigned_long *)0x930f15,(char (*) [2])pBVar45);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,TimelineSemaphoreSubmitInfo._0_8_,0,0,0);
              }
              if ((uint32_t *)TimelineSemaphoreSubmitInfo._0_8_ !=
                  &TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount) {
                operator_delete((void *)TimelineSemaphoreSubmitInfo._0_8_,
                                TimelineSemaphoreSubmitInfo._16_8_ + 1);
              }
            }
            uVar29 = uVar29 + 1;
            ppVVar27 = (this->m_VkWaitSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            iVar37._M_current =
                 (this->m_VkWaitSemaphores).
                 super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            lVar32 = lVar32 + 8;
          } while (uVar29 < (ulong)((long)iVar37._M_current - (long)ppVVar27 >> 3));
        }
        if (iVar37._M_current ==
            (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*const&>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkWaitSemaphores,iVar37,&WaitSem);
          pBVar34 = pBVar45;
        }
        else {
          *iVar37._M_current = WaitSem;
          pppVVar2 = &(this->m_VkWaitSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
          pBVar34 = pBVar45;
        }
        iVar12._M_current =
             (this->m_WaitSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pBVar45 = pBVar34;
        if (iVar12._M_current ==
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &this->m_WaitSemaphoreValues,iVar12,(unsigned_long *)&pMemVk);
        }
        else {
          *iVar12._M_current = (unsigned_long)pMemVk.m_pObject;
          (this->m_WaitSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        bVar17 = true;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < pBVar34->NumWaitFences);
  }
  TimelineSemaphoreSubmitInfo._0_8_ =
       (long)(this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  uVar41 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&TimelineSemaphoreSubmitInfo);
  BindSparse.waitSemaphoreCount = uVar41;
  if (uVar41 == 0) {
    BindSparse.pWaitSemaphores = (pointer)0x0;
  }
  else {
    BindSparse.pWaitSemaphores =
         (this->m_VkWaitSemaphores).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  TimelineSemaphoreSubmitInfo._0_8_ =
       (long)(this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  uVar41 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&TimelineSemaphoreSubmitInfo);
  BindSparse.signalSemaphoreCount = uVar41;
  if (uVar41 == 0) {
    BindSparse.pSignalSemaphores = (pointer)0x0;
  }
  else {
    BindSparse.pSignalSemaphores =
         (this->m_VkSignalSemaphores).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = 0;
  TimelineSemaphoreSubmitInfo._36_4_ = 0;
  TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues = (uint64_t *)0x0;
  TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount = 0;
  TimelineSemaphoreSubmitInfo._20_4_ = 0;
  TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues = (uint64_t *)0x0;
  TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  TimelineSemaphoreSubmitInfo._4_4_ = 0;
  if (bVar17) {
    TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
    TimelineSemaphoreSubmitInfo._4_4_ = 0;
    TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues = (uint64_t *)0x0;
    TimelineSemaphoreSubmitInfo._16_8_ = BindSparse._16_8_ & 0xffffffff;
    TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues = (pointer)0x0;
    if (BindSparse.waitSemaphoreCount != 0) {
      TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues =
           (this->m_WaitSemaphoreValues).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    TimelineSemaphoreSubmitInfo._36_4_ = 0;
    TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = uVar41;
    BindSparse.pNext = &TimelineSemaphoreSubmitInfo;
    if (uVar41 != 0) {
      TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues =
           (this->m_SignalSemaphoreValues).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  TimelineSemaphoreSubmitInfo.pNext = (void *)0x0;
  this_02 = (CommandQueueVkImpl *)
            DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::LockCommandQueue
                      (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  if (this_02 != (CommandQueueVkImpl *)0x0) {
    CheckDynamicType<Diligent::CommandQueueVkImpl,Diligent::ICommandQueueVk>
              ((ICommandQueueVk *)this_02);
  }
  CommandQueueVkImpl::BindSparse(this_02,&BindSparse);
  CommandQueueVkImpl::GetLastSyncPoint((CommandQueueVkImpl *)&pMemVk);
  RVar18 = pMemVk;
  pMemVk.m_pObject = (IDeviceMemoryVk *)0x0;
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::UnlockCommandQueue
            (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  if ((!bVar17) && (pBVar45->NumSignalFences != 0)) {
    uVar42 = 0;
    do {
      pFVar13 = (FenceVkImpl *)pBVar45->ppSignalFences[uVar42];
      if (pFVar13 != (FenceVkImpl *)0x0) {
        CheckDynamicType<Diligent::FenceVkImpl,Diligent::IFence>((IFence *)pFVar13);
      }
      if ((pFVar13->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
        SVar20 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        Value = pBVar45->pSignalFenceValues[uVar42];
        local_50.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)RVar18.m_pObject;
        local_50.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pRStack_1b0;
        if (pRStack_1b0 != (RefCountersImpl *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)pRStack_1b0->m_ObjectWrapperBuffer =
                 (int)pRStack_1b0->m_ObjectWrapperBuffer[0] + 1;
            UNLOCK();
          }
          else {
            *(int *)pRStack_1b0->m_ObjectWrapperBuffer =
                 (int)pRStack_1b0->m_ObjectWrapperBuffer[0] + 1;
          }
        }
        FenceVkImpl::AddPendingSyncPoint(pFVar13,SVar20,Value,&local_50);
        if ((RefCountersImpl *)
            local_50.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (RefCountersImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < pBVar45->NumSignalFences);
  }
  ppVVar15 = (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar15) {
    (this->m_VkSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar15;
  }
  puVar16 = (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar16) {
    (this->m_SignalSemaphoreValues).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar16;
  }
  ppVVar15 = (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkWaitSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar15) {
    (this->m_VkWaitSemaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVVar15;
  }
  puVar16 = (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar16) {
    (this->m_WaitSemaphoreValues).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar16;
  }
  if (pRStack_1b0 != (RefCountersImpl *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pRStack_1b0);
  }
  if (vkImageMemoryBinds.
      super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkImageMemoryBinds.
                    super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkImageMemoryBinds.
                          super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkImageMemoryBinds.
                          super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkMemoryBinds.
                    super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vkMemoryBinds.
                          super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkMemoryBinds.
                          super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkImageBinds.
                    super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkImageBinds.
                          super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkImageBinds.
                          super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkImageOpaqueBinds.
                    super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkImageOpaqueBinds.
                          super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkImageOpaqueBinds.
                          super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkBufferBinds.
                    super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkBufferBinds.
                          super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkBufferBinds.
                          super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BindSparseResourceMemory(const BindSparseResourceMemoryAttribs& Attribs)
{
    TDeviceContextBase::BindSparseResourceMemory(Attribs, 0);

    VERIFY_EXPR(Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0);

    Flush();

    // Calculate the required array sizes
    Uint32 ImageBindCount       = 0;
    Uint32 ImageOpqBindCount    = 0;
    Uint32 MemoryBindCount      = 0;
    Uint32 ImageMemoryBindCount = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
        MemoryBindCount += Attribs.pBufferBinds[i].NumRanges;

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind           = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(Bind.pTexture);
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 j = 0; j < Bind.NumRanges; ++j)
        {
            if (Bind.pRanges[j].MipLevel >= TexSparseProps.FirstMipInTail)
            {
                ++MemoryBindCount;
                ++ImageOpqBindCount;
            }
            else
            {
                ++NumImageBindsInRange;
                ++ImageMemoryBindCount;
            }
        }
        if (NumImageBindsInRange > 0)
            ++ImageBindCount;
    }

    std::vector<VkSparseBufferMemoryBindInfo>      vkBufferBinds{Attribs.NumBufferBinds};
    std::vector<VkSparseImageOpaqueMemoryBindInfo> vkImageOpaqueBinds{ImageOpqBindCount};
    std::vector<VkSparseImageMemoryBindInfo>       vkImageBinds{ImageBindCount};
    std::vector<VkSparseMemoryBind>                vkMemoryBinds{MemoryBindCount};
    std::vector<VkSparseImageMemoryBind>           vkImageMemoryBinds{ImageMemoryBindCount};

    MemoryBindCount      = 0;
    ImageMemoryBindCount = 0;
    ImageBindCount       = 0;
    ImageOpqBindCount    = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& BuffBind = Attribs.pBufferBinds[i];
        const BufferVkImpl*               pBuffVk  = ClassPtrCast<const BufferVkImpl>(BuffBind.pBuffer);
#ifdef DILIGENT_DEVELOPMENT
        const SparseBufferProperties& BuffSparseProps = pBuffVk->GetSparseProperties();
#endif

        VkSparseBufferMemoryBindInfo& vkBuffBind{vkBufferBinds[i]};
        vkBuffBind.buffer    = pBuffVk->GetVkBuffer();
        vkBuffBind.bindCount = BuffBind.NumRanges;
        vkBuffBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

        for (Uint32 r = 0; r < BuffBind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& SrcRange = BuffBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>     pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const DeviceMemoryRangeVk MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR(MemRangeVk.Offset % BuffSparseProps.BlockSize == 0,
                          "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");

            VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
            vkMemBind.resourceOffset = SrcRange.BufferOffset;
            vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero when range is unbound
            vkMemBind.memory         = MemRangeVk.Handle;
            vkMemBind.memoryOffset   = MemRangeVk.Offset;
            vkMemBind.flags          = 0;

            VERIFY(vkMemBind.size > 0, "Buffer memory size must not be zero");
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& TexBind        = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(TexBind.pTexture);
        const TextureDesc&                 TexDesc        = pTexVk->GetDesc();
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();
        const TextureFormatAttribs&        FmtAttribs     = GetTextureFormatAttribs(TexDesc.Format);
        const VkImageAspectFlags           aspectMask     = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 r = 0; r < TexBind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& SrcRange = TexBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>      pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const auto MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR((MemRangeVk.Offset % TexSparseProps.BlockSize) == 0,
                          "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");

            if (SrcRange.MipLevel < TexSparseProps.FirstMipInTail)
            {
                const Uint32 TexWidth  = std::max(1u, TexDesc.Width >> SrcRange.MipLevel);
                const Uint32 TexHeight = std::max(1u, TexDesc.Height >> SrcRange.MipLevel);
                const Uint32 TexDepth  = std::max(1u, TexDesc.GetDepth() >> SrcRange.MipLevel);

                VkSparseImageMemoryBind& vkImgMemBind{vkImageMemoryBinds[size_t{ImageMemoryBindCount} + size_t{NumImageBindsInRange}]};
                vkImgMemBind.subresource.arrayLayer = SrcRange.ArraySlice;
                vkImgMemBind.subresource.aspectMask = aspectMask;
                vkImgMemBind.subresource.mipLevel   = SrcRange.MipLevel;
                vkImgMemBind.offset.x               = static_cast<int32_t>(SrcRange.Region.MinX);
                vkImgMemBind.offset.y               = static_cast<int32_t>(SrcRange.Region.MinY);
                vkImgMemBind.offset.z               = static_cast<int32_t>(SrcRange.Region.MinZ);
                vkImgMemBind.extent.width           = static_cast<int32_t>(std::min(SrcRange.Region.Width(), TexWidth - SrcRange.Region.MinX));
                vkImgMemBind.extent.height          = static_cast<int32_t>(std::min(SrcRange.Region.Height(), TexHeight - SrcRange.Region.MinY));
                vkImgMemBind.extent.depth           = static_cast<int32_t>(std::min(SrcRange.Region.Depth(), TexDepth - SrcRange.Region.MinZ));
                vkImgMemBind.memory                 = MemRangeVk.Handle;
                vkImgMemBind.memoryOffset           = MemRangeVk.Offset;
                vkImgMemBind.flags                  = 0;

                ++NumImageBindsInRange;
            }
            else
            {
                // Bind mip tail memory
                VkSparseImageOpaqueMemoryBindInfo& vkImgOpqBind{vkImageOpaqueBinds[ImageOpqBindCount++]};
                vkImgOpqBind.image     = pTexVk->GetVkImage();
                vkImgOpqBind.bindCount = 1;
                vkImgOpqBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

                VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
                vkMemBind.resourceOffset = TexSparseProps.MipTailOffset + TexSparseProps.MipTailStride * SrcRange.ArraySlice + SrcRange.OffsetInMipTail;
                vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero if tail is unbound
                vkMemBind.memory         = MemRangeVk.Handle;
                vkMemBind.memoryOffset   = MemRangeVk.Offset;
                vkMemBind.flags          = 0;

                VERIFY(vkMemBind.size > 0, "Texture mip tail memory size must not be zero");
                VERIFY(!(TexDesc.IsArray() && (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == 0) || TexSparseProps.MipTailStride != 0,
                       "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero");
            }
        }

        if (NumImageBindsInRange > 0)
        {
            VkSparseImageMemoryBindInfo& vkImgBind{vkImageBinds[ImageBindCount++]};
            vkImgBind.image     = pTexVk->GetVkImage();
            vkImgBind.bindCount = NumImageBindsInRange;
            vkImgBind.pBinds    = &vkImageMemoryBinds[ImageMemoryBindCount];

            ImageMemoryBindCount += NumImageBindsInRange;
        }
    }

    VERIFY_EXPR(MemoryBindCount == vkMemoryBinds.size());
    VERIFY_EXPR(ImageMemoryBindCount == vkImageMemoryBinds.size());
    VERIFY_EXPR(ImageBindCount == vkImageBinds.size());
    VERIFY_EXPR(ImageOpqBindCount == vkImageOpaqueBinds.size());

    VkBindSparseInfo BindSparse{};
    BindSparse.sType                = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
    BindSparse.bufferBindCount      = StaticCast<uint32_t>(vkBufferBinds.size());
    BindSparse.pBufferBinds         = !vkBufferBinds.empty() ? vkBufferBinds.data() : nullptr;
    BindSparse.imageOpaqueBindCount = StaticCast<uint32_t>(vkImageOpaqueBinds.size());
    BindSparse.pImageOpaqueBinds    = !vkImageOpaqueBinds.empty() ? vkImageOpaqueBinds.data() : nullptr;
    BindSparse.imageBindCount       = StaticCast<uint32_t>(vkImageBinds.size());
    BindSparse.pImageBinds          = !vkImageBinds.empty() ? vkImageBinds.data() : nullptr;

    VERIFY_EXPR(m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty());
    VERIFY_EXPR(m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty());

    bool UsedTimelineSemaphore = false;
    for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
    {
        FenceVkImpl* pFenceVk    = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
        Uint64       SignalValue = Attribs.pSignalFenceValues[i];
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(SignalValue);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(SignalValue);
    }

    for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
    {
        FenceVkImpl* pFenceVk  = ClassPtrCast<FenceVkImpl>(Attribs.ppWaitFences[i]);
        Uint64       WaitValue = Attribs.pWaitFenceValues[i];
        pFenceVk->DvpDeviceWait(WaitValue);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t j = 0; j < m_VkWaitSemaphores.size(); ++j)
            {
                if (m_VkWaitSemaphores[j] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", WaitValue,
                                      ") is already added to the wait operation with value (", m_WaitSemaphoreValues[j], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitSemaphoreValues.push_back(WaitValue);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), WaitValue))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }
    BindSparse.waitSemaphoreCount   = StaticCast<uint32_t>(m_VkWaitSemaphores.size());
    BindSparse.pWaitSemaphores      = BindSparse.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    BindSparse.signalSemaphoreCount = StaticCast<uint32_t>(m_VkSignalSemaphores.size());
    BindSparse.pSignalSemaphores    = BindSparse.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        BindSparse.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = BindSparse.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = BindSparse.waitSemaphoreCount != 0 ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = BindSparse.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = BindSparse.signalSemaphoreCount != 0 ? m_SignalSemaphoreValues.data() : nullptr;
    }

    SyncPointVkPtr pSyncPoint;
    {
        CommandQueueVkImpl* pQueueVk = ClassPtrCast<CommandQueueVkImpl>(LockCommandQueue());

        pQueueVk->BindSparse(BindSparse);
        pSyncPoint = pQueueVk->GetLastSyncPoint();

        UnlockCommandQueue();
    }

    if (!UsedTimelineSemaphore)
    {
        for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
        {
            FenceVkImpl* pFenceVk = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
            if (!pFenceVk->IsTimelineSemaphore())
                pFenceVk->AddPendingSyncPoint(GetCommandQueueId(), Attribs.pSignalFenceValues[i], pSyncPoint);
        }
    }

    m_VkSignalSemaphores.clear();
    m_SignalSemaphoreValues.clear();
    m_VkWaitSemaphores.clear();
    m_WaitSemaphoreValues.clear();
}